

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int top;
  uint _c;
  size_t sVar1;
  _func_int *p_Var2;
  long *plVar3;
  void *pvVar4;
  Layer *pLVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  code *pcVar15;
  void *pvVar16;
  uint _h;
  uint uVar17;
  ulong uVar18;
  void *pvVar19;
  int p;
  int iVar20;
  code *pcVar21;
  void *pvVar22;
  long lVar23;
  Convolution *this_00;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int i_1;
  int iVar31;
  void *pvVar32;
  int q;
  ulong uVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  Mat local_538;
  float t1 [6];
  float t0 [6];
  float w5 [6];
  float w4 [6];
  float d2 [6];
  float t5 [6];
  float t4 [6];
  float t3 [6];
  float t2 [6];
  Option opt_g;
  Mat bottom_blob_int8;
  Option opt_g_1;
  float w3 [6];
  float w2 [6];
  float w1 [6];
  float w0 [6];
  float d5_1 [4];
  float d4_1 [4];
  float d3 [6];
  int local_1bc;
  Mat top_blob_g;
  float d4 [6];
  float d5 [6];
  Mat bottom_blob_unbordered;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  float afStack_78 [4];
  float o2 [4];
  float o1 [4];
  float o0 [4];
  
  this_00 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  if (bottom_blob->dims != 3) {
LAB_0012376d:
    iVar20 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
    return iVar20;
  }
  iVar20 = this_00->kernel_w;
  if (iVar20 != this_00->kernel_h) goto LAB_0012376d;
  iVar26 = this_00->stride_w;
  if ((iVar26 != this_00->stride_h) || (7 < iVar26 || 7 < iVar20)) goto LAB_0012376d;
  if (this_00->dilation_w != this_00->dilation_h) goto LAB_0012376d;
  if (this_00->use_int8_inference == true) {
    lVar29 = (long)iVar20 + -1;
    lVar30 = (long)iVar26 + -1;
    if (this_00->use_int8_requantize == true) {
      pcVar15 = (code *)(&PTR_conv1x1s1_int8_requant_sse_0016a290)[lVar29 * 4 + lVar30];
      pcVar21 = (code *)0x0;
    }
    else {
      pcVar21 = (code *)(&PTR_conv1x1s1_int8_dequant_sse_0016a1b0)[lVar29 * 4 + lVar30];
      pcVar15 = (code *)0x0;
    }
    if (pcVar15 == (code *)0x0 && pcVar21 == (code *)0x0) goto LAB_0012376d;
  }
  else {
    if (*(long *)((long)iVar20 * 0x20 + 0x16a0a8 + (long)iVar26 * 8) == 0) goto LAB_0012376d;
    if (this_00->dilation_w != 1) {
      if (iVar26 == 1) {
        iVar20 = (*this->_vptr_Convolution_x86[3])(this,bottom_blob);
        return iVar20;
      }
      goto LAB_0012376d;
    }
    pcVar15 = (code *)0x0;
    pcVar21 = (code *)0x0;
  }
  iVar31 = bottom_blob->w;
  iVar14 = bottom_blob->h;
  iVar28 = bottom_blob->c;
  sVar1 = bottom_blob->elemsize;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((sVar1 != 1 & (&this->field_0x1c0)[(long)this->_vptr_Convolution_x86[-3]]) == 1) {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.packing = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar31,iVar14,iVar28,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar28 = -100;
      goto LAB_001250ac;
    }
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.vulkan_compute = opt->vulkan_compute;
    opt_g._25_3_ = *(undefined3 *)&opt->field_0x19;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.blob_allocator = bottom_blob_int8.allocator;
    (**(code **)(**(long **)(&this->field_0x1c8 + (long)this->_vptr_Convolution_x86[-3]) + 0x38))
              (*(long **)(&this->field_0x1c8 + (long)this->_vptr_Convolution_x86[-3]),bottom_blob);
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  local_538.data = bottom_blob_unbordered.data;
  local_538.refcount = bottom_blob_unbordered.refcount;
  local_538.elemsize = bottom_blob_unbordered.elemsize;
  local_538.packing = bottom_blob_unbordered.packing;
  local_538.allocator = bottom_blob_unbordered.allocator;
  local_538.dims = bottom_blob_unbordered.dims;
  local_538.w = bottom_blob_unbordered.w;
  local_538.h = bottom_blob_unbordered.h;
  local_538.c = bottom_blob_unbordered.c;
  local_538.cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  iVar28 = -100;
  iVar25 = *(int *)(&this->field_0x9c + (long)this->_vptr_Convolution_x86[-3]);
  top = *(int *)(&this->field_0xa0 + (long)this->_vptr_Convolution_x86[-3]);
  if (top < 1 && iVar25 < 1) {
    if (top == -0xe9 && iVar25 == -0xe9) {
      iVar25 = ~((iVar31 + -1) % iVar26) + iVar20;
      iVar31 = ~((iVar14 + -1) % iVar26) + iVar20;
      if ((0 < iVar25) || (0 < iVar31)) {
        copy_make_border(&bottom_blob_unbordered,&local_538,iVar31 / 2,iVar31 - iVar31 / 2,
                         iVar25 / 2,iVar25 - iVar25 / 2,0,0.0,opt->workspace_allocator,
                         opt->num_threads);
        if ((local_538.data == (void *)0x0) || ((long)local_538.c * local_538.cstep == 0))
        goto LAB_001250a2;
      }
      iVar31 = local_538.w;
      iVar14 = local_538.h;
    }
LAB_0012384c:
    iVar31 = (iVar31 - iVar20) / iVar26 + 1;
    iVar20 = (iVar14 - iVar20) / iVar26 + 1;
    p_Var2 = this->_vptr_Convolution_x86[-3];
    if ((&this->field_0x1c0)[(long)p_Var2] == '\x01') {
      if ((&this->field_0x1c1)[(long)p_Var2] == '\x01') {
        bottom_blob_int8.elemsize._0_4_ = 0;
        bottom_blob_int8.elemsize._4_4_ = 0;
        bottom_blob_int8.packing = 0;
        bottom_blob_int8.data = (void *)0x0;
        bottom_blob_int8.refcount._0_4_ = 0;
        bottom_blob_int8.refcount._4_4_ = 0;
        bottom_blob_int8.allocator = (Allocator *)0x0;
        bottom_blob_int8.dims = 0;
        bottom_blob_int8.w = 0;
        bottom_blob_int8.h = 0;
        bottom_blob_int8.c = 0;
        bottom_blob_int8.cstep = 0;
        Mat::create(&bottom_blob_int8,iVar31,iVar20,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                            (long)&(this->weight_sgemm_data).data),4,opt->workspace_allocator);
        if ((bottom_blob_int8.data != (void *)0x0) &&
           ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
          Mat::create(top_blob,iVar31,iVar20,
                      *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                              (long)&(this->weight_sgemm_data).data),1,opt->blob_allocator);
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if (this->use_winograd3x3 == true) {
              conv3x3s1_winograd43_int8_sse
                        (&local_538,&bottom_blob_int8,&this->weight_3x3_winograd23_data,opt);
              for (lVar29 = 0;
                  lVar29 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                                   (long)&(this->weight_sgemm_data).data); lVar29 = lVar29 + 1) {
                uVar7._0_1_ = opt->lightmode;
                uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
                uVar7._4_4_ = opt->num_threads;
                uVar8._0_1_ = opt->vulkan_compute;
                uVar8._1_3_ = *(undefined3 *)&opt->field_0x19;
                uVar8._4_4_ = opt->use_winograd_convolution;
                opt_g_1.use_sgemm_convolution = opt->use_sgemm_convolution;
                opt_g_1.use_int8_inference = opt->use_int8_inference;
                opt_g_1.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
                opt_g_1.workspace_allocator._4_4_ = (float)((ulong)opt->workspace_allocator >> 0x20)
                ;
                opt_g_1._24_4_ = SUB84(uVar8,0);
                opt_g_1._0_4_ = SUB84(uVar7,0);
                opt_g_1.num_threads = 1;
                opt_g_1.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
                opt_g_1.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
                opt_g_1.use_winograd_convolution = uVar8._4_4_;
                Mat::channel_range((Mat *)&opt_g,&bottom_blob_int8,(int)lVar29,1);
                Mat::channel_range(&top_blob_g,top_blob,(int)lVar29,1);
                plVar3 = *(long **)(*(long *)(&this->field_0x1e8 +
                                             (long)this->_vptr_Convolution_x86[-3]) + lVar29 * 8);
                (**(code **)(*plVar3 + 0x38))(plVar3,(Mat *)&opt_g,&top_blob_g,&opt_g_1);
                Mat::~Mat(&top_blob_g);
                Mat::~Mat((Mat *)&opt_g);
              }
            }
            else {
              p_Var2 = this->_vptr_Convolution_x86[-3];
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_90,
                         (vector<float,_std::allocator<float>_> *)
                         (&this->field_0x218 + (long)p_Var2));
              (*pcVar15)(&local_538,top_blob,&this->field_0xf8 + (long)p_Var2,
                         &this->field_0x138 + (long)p_Var2,&local_90,opt);
              std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_90);
            }
            Mat::~Mat(&bottom_blob_int8);
LAB_0012509f:
            iVar28 = 0;
            goto LAB_001250a2;
          }
        }
        Mat::~Mat(&bottom_blob_int8);
      }
      else {
        Mat::create(top_blob,iVar31,iVar20,
                    *(int *)(p_Var2 + 0x28 + (long)&(this->weight_sgemm_data).data),4,
                    opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (this->use_winograd3x3 != true) {
            p_Var2 = this->_vptr_Convolution_x86[-3];
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x200 + (long)p_Var2))
            ;
            (*pcVar21)(&local_538,top_blob,&this->field_0xf8 + (long)p_Var2,
                       &this->field_0x138 + (long)p_Var2,&local_a8,opt);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_a8);
            goto LAB_0012509f;
          }
          conv3x3s1_winograd43_int8_sse(&local_538,top_blob,&this->weight_3x3_winograd23_data,opt);
          iVar28 = 0;
          for (lVar29 = 0;
              lVar29 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                               (long)&(this->weight_sgemm_data).data); lVar29 = lVar29 + 1) {
            uVar9._0_1_ = opt->lightmode;
            uVar9._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar9._4_4_ = opt->num_threads;
            opt_g.workspace_allocator = opt->workspace_allocator;
            opt_g.vulkan_compute = opt->vulkan_compute;
            opt_g._25_3_ = *(undefined3 *)&opt->field_0x19;
            opt_g.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g.use_int8_inference = opt->use_int8_inference;
            opt_g._0_4_ = SUB84(uVar9,0);
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob->allocator;
            Mat::channel_range(&bottom_blob_int8,top_blob,(int)lVar29,1);
            plVar3 = *(long **)(*(long *)(&this->field_0x1d0 + (long)this->_vptr_Convolution_x86[-3]
                                         ) + lVar29 * 8);
            (**(code **)(*plVar3 + 0x48))(plVar3,&bottom_blob_int8,&opt_g);
            Mat::~Mat(&bottom_blob_int8);
          }
        }
      }
    }
    else {
      Mat::create(top_blob,iVar31,iVar20,
                  *(int *)(p_Var2 + 0x28 + (long)&(this->weight_sgemm_data).data),sVar1,
                  opt->blob_allocator);
      sVar1 = local_538.cstep;
      if ((top_blob->data != (void *)0x0) &&
         (_c = top_blob->c, top_blob->cstep * (long)(int)_c != 0)) {
        p_Var2 = this->_vptr_Convolution_x86[-3];
        if (this->use_winograd3x3 == true) {
          iVar28 = local_538.c;
          iVar20 = top_blob->w;
          iVar26 = top_blob->h;
          opt_g._0_8_ = local_538.data;
          opt_g.blob_allocator = (Allocator *)local_538.refcount;
          opt_g.workspace_allocator = (Allocator *)local_538.elemsize;
          opt_g._24_4_ = local_538.packing;
          opt_g._32_8_ = local_538.allocator;
          iVar31 = local_538.w;
          iVar14 = local_538.h;
          if ((Allocator *)local_538.refcount != (Allocator *)0x0) {
            LOCK();
            *local_538.refcount = *local_538.refcount + 1;
            UNLOCK();
          }
          uVar6 = (iVar20 + 3) / 4;
          uVar33 = (long)(iVar26 + 3) / 4;
          iVar26 = uVar6 * 4 + 2;
          iVar20 = (int)uVar33;
          copy_make_border(&local_538,(Mat *)&opt_g,0,(iVar20 * 4 + 2) - local_538.h,0,
                           iVar26 - local_538.w,0,0.0,opt->workspace_allocator,opt->num_threads);
          pvVar4 = ((Mat *)(&this->field_0x138 + (long)p_Var2))->data;
          top_blob_g.elemsize._0_4_ = 0;
          top_blob_g.elemsize._4_4_ = 0;
          top_blob_g.packing = 0;
          top_blob_g.data = (void *)0x0;
          top_blob_g.refcount._0_4_ = 0;
          top_blob_g.refcount._4_4_ = 0;
          top_blob_g.allocator = (Allocator *)0x0;
          top_blob_g.dims = 0;
          top_blob_g.w = 0;
          top_blob_g.h = 0;
          top_blob_g.c = 0;
          top_blob_g.cstep = 0;
          _h = iVar20 * uVar6;
          Mat::create(&top_blob_g,0x24,_h,iVar28,4,opt->workspace_allocator);
          uVar18 = 0;
          uVar27 = 0;
          if (0 < (int)uVar6) {
            uVar27 = uVar6;
          }
          uVar33 = uVar33 & 0xffffffff;
          if (iVar20 < 1) {
            uVar33 = uVar18;
          }
          uVar24 = (ulong)(uint)iVar28;
          if (iVar28 < 1) {
            uVar24 = uVar18;
          }
          lVar30 = (long)(int)(uVar6 * 4);
          lVar29 = lVar30 * 4 + 8;
          for (; uVar18 != uVar24; uVar18 = uVar18 + 1) {
            pvVar22 = (void *)(sVar1 * uVar18 * (long)opt_g.workspace_allocator + opt_g._0_8_);
            bottom_blob_int8.refcount._0_4_ = 0;
            bottom_blob_int8.refcount._4_4_ = 0;
            bottom_blob_int8.elemsize._0_4_ = SUB84(opt_g.workspace_allocator,0);
            bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt_g.workspace_allocator >> 0x20)
            ;
            bottom_blob_int8.packing = opt_g._24_4_;
            bottom_blob_int8.allocator = (Allocator *)opt_g._32_8_;
            bottom_blob_int8.w = iVar31;
            bottom_blob_int8.dims = 2;
            bottom_blob_int8.c = 1;
            bottom_blob_int8.h = iVar14;
            bottom_blob_int8.cstep = (size_t)(iVar14 * iVar31);
            bottom_blob_int8.data = pvVar22;
            Mat::~Mat(&bottom_blob_int8);
            pvVar19 = (void *)(top_blob_g.cstep * uVar18 *
                               CONCAT44(top_blob_g.elemsize._4_4_,(undefined4)top_blob_g.elemsize) +
                              (long)top_blob_g.data);
            bottom_blob_int8.refcount._0_4_ = 0;
            bottom_blob_int8.refcount._4_4_ = 0;
            bottom_blob_int8.elemsize._0_4_ = (undefined4)top_blob_g.elemsize;
            bottom_blob_int8.elemsize._4_4_ = top_blob_g.elemsize._4_4_;
            bottom_blob_int8.packing = top_blob_g.packing;
            bottom_blob_int8.allocator = top_blob_g.allocator;
            bottom_blob_int8.w = top_blob_g.w;
            bottom_blob_int8.dims = 2;
            bottom_blob_int8.c = 1;
            bottom_blob_int8.h = top_blob_g.h;
            bottom_blob_int8.cstep = (size_t)(top_blob_g.h * top_blob_g.w);
            bottom_blob_int8.data = pvVar19;
            Mat::~Mat(&bottom_blob_int8);
            for (uVar12 = 0; uVar12 != uVar33; uVar12 = uVar12 + 1) {
              pvVar16 = (void *)((long)pvVar22 + (long)(iVar26 * 4 * (int)uVar12) * 4);
              for (uVar17 = 0; uVar17 != uVar27; uVar17 = uVar17 + 1) {
                for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 4) {
                  *(undefined4 *)((long)&bottom_blob_int8.data + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar23);
                  lVar10 = lVar29 * 2 + lVar23;
                  *(undefined4 *)(&opt_g_1.lightmode + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar30 * 4 + lVar23 + 8);
                  *(undefined4 *)((long)d2 + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar30 * 8 + lVar23 + 0x10);
                  lVar11 = lVar29 + lVar10;
                  *(undefined4 *)((long)d3 + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar30 * 4 + lVar10 + 8);
                  *(undefined4 *)((long)d4 + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar30 * 4 + lVar11 + 8);
                  *(undefined4 *)((long)d5 + lVar23) =
                       *(undefined4 *)((long)pvVar16 + lVar30 * 8 + lVar11 + 0x10);
                }
                for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 4) {
                  fVar35 = *(float *)((long)d2 + lVar23);
                  fVar36 = *(float *)((long)d4 + lVar23);
                  fVar37 = *(float *)(&opt_g_1.lightmode + lVar23);
                  fVar38 = *(float *)((long)d3 + lVar23);
                  *(float *)((long)w0 + lVar23) =
                       fVar35 * -5.0 + fVar36 +
                       *(float *)((long)&bottom_blob_int8.data + lVar23) * 4.0;
                  *(float *)((long)w1 + lVar23) = fVar38 + fVar36 + (fVar37 + fVar35) * -4.0;
                  *(float *)((long)w2 + lVar23) = (fVar36 - fVar38) + (fVar37 - fVar35) * 4.0;
                  *(float *)((long)w3 + lVar23) =
                       ((fVar36 - fVar35) - (fVar37 + fVar37)) + fVar38 + fVar38;
                  *(float *)((long)w4 + lVar23) =
                       (fVar37 + fVar37 + fVar36) - (fVar38 + fVar38 + fVar35);
                  *(float *)((long)w5 + lVar23) =
                       fVar38 * -5.0 + fVar37 * 4.0 + *(float *)((long)d5 + lVar23);
                }
                t0[0] = w0[0];
                t1[0] = w0[1];
                t2[0] = w0[2];
                t3[0] = w0[3];
                t4[0] = w0[4];
                t5[0] = w0[5];
                t0[1] = w1[0];
                t1[1] = w1[1];
                t2[1] = w1[2];
                t3[1] = w1[3];
                t4[1] = w1[4];
                t5[1] = w1[5];
                t0[2] = w2[0];
                t1[2] = w2[1];
                t2[2] = w2[2];
                t3[2] = w2[3];
                t4[2] = w2[4];
                t5[2] = w2[5];
                t0[3] = w3[0];
                t1[3] = w3[1];
                t2[3] = w3[2];
                t3[3] = w3[3];
                t4[3] = w3[4];
                t5[3] = w3[5];
                t0[4] = w4[0];
                t1[4] = w4[1];
                t2[4] = w4[2];
                t3[4] = w4[3];
                t4[4] = w4[4];
                t5[4] = w4[5];
                t0[5] = w5[0];
                t1[5] = w5[1];
                t2[5] = w5[2];
                t3[5] = w5[3];
                t4[5] = w5[4];
                t5[5] = w5[5];
                for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 4) {
                  fVar35 = *(float *)((long)t2 + lVar23);
                  fVar36 = *(float *)((long)t4 + lVar23);
                  fVar37 = *(float *)((long)t1 + lVar23);
                  fVar38 = *(float *)((long)t3 + lVar23);
                  *(float *)((long)&bottom_blob_int8.data + lVar23) =
                       fVar35 * -5.0 + fVar36 + *(float *)((long)t0 + lVar23) * 4.0;
                  *(float *)(&opt_g_1.lightmode + lVar23) =
                       fVar38 + fVar36 + (fVar37 + fVar35) * -4.0;
                  *(float *)((long)d2 + lVar23) = (fVar36 - fVar38) + (fVar37 - fVar35) * 4.0;
                  *(float *)((long)d3 + lVar23) =
                       ((fVar36 - fVar35) - (fVar37 + fVar37)) + fVar38 + fVar38;
                  *(float *)((long)d4 + lVar23) =
                       (fVar37 + fVar37 + fVar36) - (fVar38 + fVar38 + fVar35);
                  *(float *)((long)d5 + lVar23) =
                       fVar38 * -5.0 + fVar37 * 4.0 + *(float *)((long)t5 + lVar23);
                }
                lVar23 = 0;
                while( true ) {
                  if (lVar23 == 0x18) break;
                  *(undefined4 *)((long)pvVar19 + lVar23) =
                       *(undefined4 *)((long)&bottom_blob_int8.data + lVar23);
                  *(undefined4 *)((long)pvVar19 + lVar23 + 0x18) =
                       *(undefined4 *)(&opt_g_1.lightmode + lVar23);
                  *(undefined4 *)((long)pvVar19 + lVar23 + 0x30) =
                       *(undefined4 *)((long)d2 + lVar23);
                  *(undefined4 *)((long)pvVar19 + lVar23 + 0x48) =
                       *(undefined4 *)((long)d3 + lVar23);
                  *(undefined4 *)((long)pvVar19 + lVar23 + 0x60) =
                       *(undefined4 *)((long)d4 + lVar23);
                  *(undefined4 *)((long)pvVar19 + lVar23 + 0x78) =
                       *(undefined4 *)((long)d5 + lVar23);
                  lVar23 = lVar23 + 4;
                }
                pvVar16 = (void *)((long)pvVar16 + 0x10);
                pvVar19 = (void *)((long)pvVar19 + 0x90);
              }
            }
          }
          bottom_blob_int8.elemsize._0_4_ = 0;
          bottom_blob_int8.elemsize._4_4_ = 0;
          bottom_blob_int8.packing = 0;
          bottom_blob_int8.data = (void *)0x0;
          bottom_blob_int8.refcount._0_4_ = 0;
          bottom_blob_int8.refcount._4_4_ = 0;
          bottom_blob_int8.allocator = (Allocator *)0x0;
          bottom_blob_int8.dims = 0;
          bottom_blob_int8.w = 0;
          bottom_blob_int8.h = 0;
          bottom_blob_int8.c = 0;
          bottom_blob_int8.cstep = 0;
          Mat::operator=((Mat *)&opt_g,&bottom_blob_int8);
          Mat::~Mat(&bottom_blob_int8);
          opt_g_1.workspace_allocator._0_4_ = 0.0;
          opt_g_1.workspace_allocator._4_4_ = 0.0;
          opt_g_1.vulkan_compute = false;
          opt_g_1._25_3_ = 0;
          opt_g_1.lightmode = false;
          opt_g_1._1_3_ = 0;
          opt_g_1.num_threads = 0;
          opt_g_1.blob_allocator._0_4_ = 0;
          opt_g_1.blob_allocator._4_4_ = 0;
          opt_g_1.use_sgemm_convolution = 0;
          opt_g_1.use_int8_inference = 0;
          Mat::create((Mat *)&opt_g_1,0x24,_h,_c,4,opt->workspace_allocator);
          uVar12 = 0;
          uVar18 = (ulong)_h;
          if ((int)_h < 1) {
            uVar18 = uVar12;
          }
          uVar13 = 0;
          if (0 < (int)_c) {
            uVar13 = (ulong)_c;
          }
          for (; uVar12 != uVar13; uVar12 = uVar12 + 1) {
            d2[5] = opt_g_1.workspace_allocator._4_4_;
            d2[4] = opt_g_1.workspace_allocator._0_4_;
            d2[0]._0_1_ = opt_g_1.lightmode;
            d2[0]._1_3_ = opt_g_1._1_3_;
            d2[1] = opt_g_1.num_threads;
            d2[2] = 0.0;
            d2[3] = 0.0;
            Mat::channel((Mat *)d3,&this->weight_3x3_winograd23_data,(int)uVar12);
            for (iVar26 = 0; uVar9 = d2._0_8_, iVar26 != (int)uVar18; iVar26 = iVar26 + 1) {
              memset(&bottom_blob_int8,0,0x90);
              for (uVar34 = 0; pvVar19 = top_blob_g.data, uVar34 != uVar24; uVar34 = uVar34 + 1) {
                iVar31 = top_blob_g.w;
                lVar23 = top_blob_g.cstep * uVar34;
                lVar29 = CONCAT44(top_blob_g.elemsize._4_4_,(undefined4)top_blob_g.elemsize);
                d4._0_8_ = lVar23 * lVar29 + (long)top_blob_g.data;
                d4[2] = 0.0;
                d4[3] = 0.0;
                d4._16_8_ = lVar29;
                Mat::~Mat((Mat *)d4);
                for (lVar30 = 0; lVar30 != 0x24; lVar30 = lVar30 + 1) {
                  *(float *)((long)&bottom_blob_int8.data + lVar30 * 4) =
                       *(float *)((long)(local_1bc * (int)uVar34) * d3._16_8_ + d3._0_8_ +
                                 lVar30 * 4) *
                       *(float *)((long)pvVar19 + lVar30 * 4 + (iVar31 * iVar26 + lVar23) * lVar29)
                       + *(float *)((long)&bottom_blob_int8.data + lVar30 * 4);
                }
              }
              for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
                *(undefined4 *)(uVar9 + lVar29 * 4) =
                     *(undefined4 *)((long)&bottom_blob_int8.data + lVar29 * 4);
              }
            }
            Mat::~Mat((Mat *)d3);
            Mat::~Mat((Mat *)d2);
          }
          bottom_blob_int8.elemsize._0_4_ = 0;
          bottom_blob_int8.elemsize._4_4_ = 0;
          bottom_blob_int8.packing = 0;
          bottom_blob_int8.data = (void *)0x0;
          bottom_blob_int8.refcount._0_4_ = 0;
          bottom_blob_int8.refcount._4_4_ = 0;
          bottom_blob_int8.allocator = (Allocator *)0x0;
          bottom_blob_int8.dims = 0;
          bottom_blob_int8.w = 0;
          bottom_blob_int8.h = 0;
          bottom_blob_int8.c = 0;
          bottom_blob_int8.cstep = 0;
          Mat::operator=(&top_blob_g,&bottom_blob_int8);
          Mat::~Mat(&bottom_blob_int8);
          bottom_blob_int8.elemsize._0_4_ = 0;
          bottom_blob_int8.elemsize._4_4_ = 0;
          bottom_blob_int8.packing = 0;
          bottom_blob_int8.data = (void *)0x0;
          bottom_blob_int8.refcount._0_4_ = 0;
          bottom_blob_int8.refcount._4_4_ = 0;
          bottom_blob_int8.allocator = (Allocator *)0x0;
          bottom_blob_int8.dims = 0;
          bottom_blob_int8.w = 0;
          bottom_blob_int8.h = 0;
          bottom_blob_int8.c = 0;
          bottom_blob_int8.cstep = 0;
          Mat::create(&bottom_blob_int8,uVar6 * 4,iVar20 * 4,_c,4,opt->workspace_allocator);
          for (uVar18 = 0; uVar18 != uVar13; uVar18 = uVar18 + 1) {
            d2._0_8_ = opt_g_1._0_8_;
            d2[2] = 0.0;
            d2[3] = 0.0;
            d2[4] = opt_g_1.workspace_allocator._0_4_;
            d2[5] = opt_g_1.workspace_allocator._4_4_;
            d3._0_8_ = bottom_blob_int8.cstep * uVar18 *
                       CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                (undefined4)bottom_blob_int8.elemsize) + (long)bottom_blob_int8.data
            ;
            d3[2] = 0.0;
            d3[3] = 0.0;
            d3[4] = (float)(undefined4)bottom_blob_int8.elemsize;
            d3[5] = (float)bottom_blob_int8.elemsize._4_4_;
            if (pvVar4 == (void *)0x0) {
              fVar35 = 0.0;
            }
            else {
              fVar35 = *(float *)((long)pvVar4 + uVar18 * 4);
            }
            lVar29 = CONCAT44(bottom_blob_int8.elemsize._4_4_,(undefined4)bottom_blob_int8.elemsize)
                     * (long)bottom_blob_int8.w;
            for (uVar24 = 0; uVar24 != uVar33; uVar24 = uVar24 + 1) {
              pvVar19 = (void *)(uVar24 * 4 * lVar29 + d3._0_8_);
              pvVar22 = (void *)((uVar24 * 4 + 1) * lVar29 + d3._0_8_);
              pvVar16 = (void *)((uVar24 * 4 + 2) * lVar29 + d3._0_8_);
              pvVar32 = (void *)((uVar24 * 4 + 3) * lVar29 + d3._0_8_);
              for (uVar12 = 0; uVar12 != uVar27; uVar12 = uVar12 + 1) {
                for (lVar30 = 0; lVar30 != 0x18; lVar30 = lVar30 + 4) {
                  *(undefined4 *)((long)d4 + lVar30) = *(undefined4 *)(opt_g_1._0_8_ + lVar30);
                  *(undefined4 *)((long)d5 + lVar30) =
                       *(undefined4 *)(opt_g_1._0_8_ + 0x18 + lVar30);
                  *(undefined4 *)((long)w0 + lVar30) =
                       *(undefined4 *)(opt_g_1._0_8_ + 0x30 + lVar30);
                  *(undefined4 *)((long)w1 + lVar30) =
                       *(undefined4 *)(opt_g_1._0_8_ + 0x48 + lVar30);
                  *(undefined4 *)((long)w2 + lVar30) =
                       *(undefined4 *)(opt_g_1._0_8_ + 0x60 + lVar30);
                  *(undefined4 *)((long)w3 + lVar30) =
                       *(undefined4 *)(opt_g_1._0_8_ + 0x78 + lVar30);
                }
                for (lVar30 = 0; lVar30 != 0x18; lVar30 = lVar30 + 4) {
                  fVar38 = *(float *)((long)w0 + lVar30) + *(float *)((long)d5 + lVar30);
                  fVar39 = *(float *)((long)w2 + lVar30) + *(float *)((long)w1 + lVar30);
                  *(float *)((long)w4 + lVar30) = *(float *)((long)d4 + lVar30) + fVar39 + fVar38;
                  fVar37 = *(float *)((long)w1 + lVar30) - *(float *)((long)w2 + lVar30);
                  fVar36 = *(float *)((long)d5 + lVar30) - *(float *)((long)w0 + lVar30);
                  *(float *)((long)w5 + lVar30) = fVar37 + fVar37 + fVar36;
                  *(float *)((long)t0 + lVar30) = fVar39 * 4.0 + fVar38;
                  *(float *)((long)t1 + lVar30) =
                       fVar37 * 8.0 + fVar36 + *(float *)((long)w3 + lVar30);
                }
                t2[0] = w4[0];
                t2[1] = w5[0];
                t2[2] = t0[0];
                t2[3] = t1[0];
                t3[0] = w4[1];
                t3[1] = w5[1];
                t3[2] = t0[1];
                t3[3] = t1[1];
                t4[0] = w4[2];
                t4[1] = w5[2];
                t4[2] = t0[2];
                t4[3] = t1[2];
                t5[0] = w4[3];
                t5[1] = w5[3];
                t5[2] = t0[3];
                t5[3] = t1[3];
                d4_1[0] = w4[4];
                d4_1[1] = w5[4];
                d4_1[2] = t0[4];
                d4_1[3] = t1[4];
                d5_1[0] = w4[5];
                d5_1[1] = w5[5];
                d5_1[2] = t0[5];
                d5_1[3] = t1[5];
                for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 4) {
                  fVar37 = *(float *)((long)t3 + lVar30) + fVar35;
                  fVar38 = *(float *)((long)t4 + lVar30) + fVar37;
                  fVar39 = *(float *)((long)t5 + lVar30) + *(float *)((long)d4_1 + lVar30);
                  *(float *)((long)o0 + lVar30) = *(float *)((long)t2 + lVar30) + fVar38 + fVar39;
                  fVar36 = *(float *)((long)t5 + lVar30) - *(float *)((long)d4_1 + lVar30);
                  fVar37 = fVar37 - *(float *)((long)t4 + lVar30);
                  *(float *)((long)o1 + lVar30) = fVar36 + fVar36 + fVar37;
                  *(float *)((long)o2 + lVar30) = fVar39 * 4.0 + fVar38;
                  *(float *)((long)afStack_78 + lVar30) =
                       fVar36 * 8.0 + fVar37 + *(float *)((long)d5_1 + lVar30);
                }
                for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 4) {
                  *(undefined4 *)((long)pvVar19 + lVar30) = *(undefined4 *)((long)o0 + lVar30);
                  *(undefined4 *)((long)pvVar22 + lVar30) = *(undefined4 *)((long)o1 + lVar30);
                  *(undefined4 *)((long)pvVar16 + lVar30) = *(undefined4 *)((long)o2 + lVar30);
                  *(undefined4 *)((long)pvVar32 + lVar30) =
                       *(undefined4 *)((long)afStack_78 + lVar30);
                }
                pvVar19 = (void *)((long)pvVar19 + 0x10);
                pvVar22 = (void *)((long)pvVar22 + 0x10);
                pvVar16 = (void *)((long)pvVar16 + 0x10);
                pvVar32 = (void *)((long)pvVar32 + 0x10);
              }
            }
            Mat::~Mat((Mat *)d3);
            Mat::~Mat((Mat *)d2);
          }
          copy_cut_border(&bottom_blob_int8,top_blob,0,bottom_blob_int8.h - top_blob->h,0,
                          bottom_blob_int8.w - top_blob->w,opt->blob_allocator,opt->num_threads);
          Mat::~Mat(&bottom_blob_int8);
          Mat::~Mat((Mat *)&opt_g_1);
          Mat::~Mat(&top_blob_g);
          Mat::~Mat((Mat *)&opt_g);
        }
        else {
          conv_im2col_sgemm_sse
                    (&local_538,top_blob,&this->weight_sgemm_data,
                     (Mat *)(&this->field_0x138 + (long)p_Var2),
                     *(int *)(p_Var2 + 0x2c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var2 + 0x30 + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var2 + 0x3c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(&this->field_0x98 + (long)p_Var2),opt);
        }
        pLVar5 = this->activation;
        iVar28 = 0;
        if (pLVar5 != (Layer *)0x0) {
          (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
        }
      }
    }
  }
  else {
    copy_make_border(&bottom_blob_unbordered,&local_538,top,top,iVar25,iVar25,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    if ((local_538.data != (void *)0x0) && ((long)local_538.c * local_538.cstep != 0)) {
      iVar31 = local_538.w;
      iVar14 = local_538.h;
      goto LAB_0012384c;
    }
  }
LAB_001250a2:
  Mat::~Mat(&local_538);
LAB_001250ac:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar28;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3)
    {
        //conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
        conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}